

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  bool bVar1;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_68;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_60;
  Ref *local_58;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_50;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_48;
  Enum local_3c;
  Table *local_38;
  u32 local_30;
  u32 local_2c;
  u32 size_local;
  u32 offset_local;
  Store *store_local;
  Table *this_local;
  Ref ref_local;
  
  local_30 = size;
  local_2c = offset;
  _size_local = store;
  store_local = (Store *)this;
  this_local = (Table *)ref.index;
  bVar1 = IsValidRange(this,offset,size);
  if (bVar1) {
    local_38 = this_local;
    local_3c = *(Enum *)&(this->type_).super_ExternType.field_0xc;
    bVar1 = Store::HasValueType(_size_local,(Ref)this_local,(ValueType)local_3c);
    if (bVar1) {
      local_50._M_current =
           (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin
                            (&this->elements_);
      local_48 = __gnu_cxx::
                 __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&local_50,(ulong)local_2c);
      local_68._M_current =
           (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin
                            (&this->elements_);
      local_60 = __gnu_cxx::
                 __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&local_68,(ulong)local_2c);
      local_58 = (Ref *)__gnu_cxx::
                        __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                        ::operator+(&local_60,(ulong)local_30);
      std::
      fill<__gnu_cxx::__normal_iterator<wabt::interp::Ref*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>,wabt::interp::Ref>
                (local_48,(__normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                           )local_58,(Ref *)&this_local);
      Result::Result((Result *)((long)&ref_local.index + 4),Ok);
      return (Result)ref_local.index._4_4_;
    }
  }
  Result::Result((Result *)((long)&ref_local.index + 4),Error);
  return (Result)ref_local.index._4_4_;
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  if (IsValidRange(offset, size) &&
      store.HasValueType(ref, type_.element)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}